

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camgeom.cc
# Opt level: O3

void gmath::refineOptimal(Matrix33d *F,Vector3d *p0,Vector3d *p1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  pointer pdVar4;
  int k;
  long lVar5;
  double (*padVar6) [3];
  vector<double,_std::allocator<double>_> *pvVar7;
  double *pdVar8;
  int k_1;
  double *pdVar9;
  double (*padVar10) [3];
  double *pdVar11;
  pointer *ppdVar12;
  int i;
  long lVar13;
  int j_2;
  double (*padVar14) [3];
  pointer *ppdVar15;
  int j;
  long lVar16;
  int j_4;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  SVector<double,_3> ret_10;
  SMatrix<double,_3,_3> ret_7;
  Vector3d e1;
  Vector3d e0;
  Matrix33d F2;
  SMatrix<double,_3,_3> ret_5;
  Matrix33d U;
  Matrix33d invT0;
  vector<double,_std::allocator<double>_> r;
  Matrix33d V;
  Vector3d W;
  Matrix33d invT1;
  Polynomial<double> local_488;
  double local_478;
  ulong uStack_470;
  double local_468;
  ulong uStack_460;
  double local_458 [4];
  undefined1 local_438 [16];
  double local_428;
  ulong uStack_420;
  double local_418;
  undefined8 uStack_410;
  double local_400 [10];
  undefined8 uStack_3b0;
  double local_3a8 [4];
  double local_388 [4];
  double local_368;
  undefined8 uStack_360;
  double local_358;
  undefined8 uStack_350;
  undefined1 local_348 [16];
  double local_338;
  double local_330;
  double local_328 [18];
  SMatrix<double,_3,_3> local_298;
  double local_250 [3];
  undefined8 local_238;
  undefined8 uStack_230;
  double local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 local_210;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  ulong uStack_1f0;
  double local_1e8;
  ulong uStack_1e0;
  double local_1d8;
  ulong uStack_1d0;
  double local_1c8;
  ulong uStack_1c0;
  double local_1b8;
  double dStack_1b0;
  undefined8 local_1a8;
  double dStack_1a0;
  double local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  vector<double,_std::allocator<double>_> local_168;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 local_128;
  SMatrix<double,_3,_3> local_120;
  SVector<double,_3> local_d8;
  double local_b8;
  double dStack_b0;
  undefined8 local_a8;
  double dStack_a0;
  double local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  double local_70 [3];
  undefined8 local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_30;
  
  local_238 = 0;
  uStack_220 = 0;
  local_250[1] = 0.0;
  lVar5 = 0;
  local_218 = 0;
  local_250[0] = 1.0;
  uStack_230 = 0x3ff0000000000000;
  local_210 = 0x3ff0000000000000;
  pdVar8 = local_70;
  local_58 = 0;
  local_38 = 0;
  uStack_40 = 0;
  local_70[1] = 0.0;
  local_70[0] = 1.0;
  uStack_50 = 0x3ff0000000000000;
  local_30 = 0x3ff0000000000000;
  local_250[2] = p0->v[0] / p0->v[2];
  local_228 = p0->v[1] / p0->v[2];
  local_70[2] = p1->v[0] / p1->v[2];
  local_48 = p1->v[1] / p1->v[2];
  padVar6 = (double (*) [3])&local_120;
  local_120.v[1][0] = 0.0;
  local_120.v[2][1] = 0.0;
  local_120.v[1][2] = 0.0;
  local_120.v[2][0] = 0.0;
  local_120.v[0][1] = 0.0;
  local_120.v[0][2] = 0.0;
  local_120.v[0][0] = 1.0;
  local_120.v[1][1] = 1.0;
  local_120.v[2][2] = 1.0;
  do {
    lVar13 = 0;
    pdVar9 = pdVar8;
    do {
      (*(double (*) [3])*padVar6)[lVar13] = *pdVar9;
      lVar13 = lVar13 + 1;
      pdVar9 = pdVar9 + 3;
    } while (lVar13 != 3);
    lVar5 = lVar5 + 1;
    padVar6 = padVar6 + 1;
    pdVar8 = pdVar8 + 1;
  } while (lVar5 != 3);
  local_298.v[1][0] = 0.0;
  local_298.v[1][2] = 0.0;
  local_298.v[2][0] = 0.0;
  local_298.v[0][1] = 0.0;
  local_298.v[0][2] = 0.0;
  local_298.v[2][1] = 0.0;
  local_298.v[0][0] = 1.0;
  local_298.v[1][1] = 1.0;
  local_298.v[2][2] = 1.0;
  padVar6 = (double (*) [3])&local_120;
  lVar5 = 0;
  do {
    lVar13 = 0;
    padVar10 = (double (*) [3])F;
    do {
      dVar25 = 0.0;
      lVar16 = 0;
      padVar14 = padVar10;
      do {
        dVar25 = dVar25 + (*(double (*) [3])*padVar6)[lVar16] * (*(double (*) [3])*padVar14)[0];
        lVar16 = lVar16 + 1;
        padVar14 = padVar14 + 1;
      } while (lVar16 != 3);
      local_298.v[lVar5][lVar13] = dVar25;
      lVar13 = lVar13 + 1;
      padVar10 = (double (*) [3])(*padVar10 + 1);
    } while (lVar13 != 3);
    lVar5 = lVar5 + 1;
    padVar6 = padVar6 + 1;
  } while (lVar5 != 3);
  local_328[3] = 0.0;
  local_328[5] = 0.0;
  local_328[6] = 0.0;
  local_328[1] = 0.0;
  local_328[2] = 0.0;
  local_328[7] = 0.0;
  local_328[0] = 1.0;
  local_328[4] = 1.0;
  local_328[8] = 1.0;
  padVar6 = (double (*) [3])&local_298;
  lVar5 = 0;
  do {
    lVar13 = 0;
    pdVar8 = local_250;
    do {
      dVar25 = 0.0;
      lVar16 = 0;
      pdVar9 = pdVar8;
      do {
        dVar25 = dVar25 + (*(double (*) [3])*padVar6)[lVar16] * *pdVar9;
        lVar16 = lVar16 + 1;
        pdVar9 = pdVar9 + 3;
      } while (lVar16 != 3);
      local_328[lVar5 * 3 + lVar13] = dVar25;
      lVar13 = lVar13 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar13 != 3);
    lVar5 = lVar5 + 1;
    padVar6 = padVar6 + 1;
  } while (lVar5 != 3);
  local_298.v[1][0] = 0.0;
  lVar5 = 0;
  local_298.v[2][1] = 0.0;
  local_298.v[1][2] = 0.0;
  local_298.v[2][0] = 0.0;
  local_298.v[0][1] = 0.0;
  local_298.v[0][2] = 0.0;
  local_298.v[0][0] = 1.0;
  local_298.v[1][1] = 1.0;
  local_298.v[2][2] = 1.0;
  local_120.v[1][0] = 0.0;
  local_120.v[2][1] = 0.0;
  local_120.v[1][2] = 0.0;
  local_120.v[2][0] = 0.0;
  local_120.v[0][1] = 0.0;
  local_120.v[0][2] = 0.0;
  local_120.v[0][0] = 1.0;
  local_120.v[1][1] = 1.0;
  local_120.v[2][2] = 1.0;
  local_d8.v[2] = 0.0;
  local_d8.v[0] = 0.0;
  local_d8.v[1] = 0.0;
  svd<double,3,3>((SMatrix<double,_3,_3> *)local_328,&local_298,&local_d8,&local_120);
  local_388[2] = 0.0;
  local_388[0] = 0.0;
  local_388[1] = 0.0;
  pdVar8 = local_120.v[0] + 2;
  do {
    local_388[lVar5] = *pdVar8;
    lVar5 = lVar5 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar5 != 3);
  local_3a8[0] = 0.0;
  local_3a8[1] = 0.0;
  local_3a8[2] = 0.0;
  pdVar8 = local_298.v[0] + 2;
  lVar5 = 0;
  do {
    local_3a8[lVar5] = *pdVar8;
    lVar5 = lVar5 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar5 != 3);
  dVar19 = local_388[1] * local_388[1];
  dVar25 = local_388[0] * local_388[0];
  lVar5 = 0;
  do {
    local_388[lVar5] = local_388[lVar5] / SQRT(dVar25 + dVar19);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  dVar19 = local_3a8[1] * local_3a8[1];
  dVar25 = local_3a8[0] * local_3a8[0];
  lVar5 = 0;
  do {
    local_3a8[lVar5] = local_3a8[lVar5] / SQRT(dVar25 + dVar19);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_1a8 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_1b8 = local_388[0];
  dStack_1b0 = local_388[1];
  dStack_1a0 = -local_388[1];
  local_198 = local_388[0];
  local_178 = 0x3ff0000000000000;
  pdVar8 = &local_b8;
  local_a8 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_b8 = local_3a8[0];
  dStack_b0 = local_3a8[1];
  dStack_a0 = -local_3a8[1];
  local_98 = local_3a8[0];
  local_78 = 0x3ff0000000000000;
  local_328[0xc] = 0.0;
  local_328[0xe] = 0.0;
  local_328[0xf] = 0.0;
  local_328[10] = 0.0;
  local_328[0xb] = 0.0;
  local_328[0x10] = 0.0;
  local_328[9] = 1.0;
  local_328[0xd] = 1.0;
  local_328[0x11] = 1.0;
  lVar5 = 0;
  do {
    lVar13 = 0;
    padVar6 = (double (*) [3])local_328;
    do {
      dVar25 = 0.0;
      lVar16 = 0;
      padVar10 = padVar6;
      do {
        dVar25 = dVar25 + pdVar8[lVar16] * (*(double (*) [3])*padVar10)[0];
        lVar16 = lVar16 + 1;
        padVar10 = padVar10 + 1;
      } while (lVar16 != 3);
      (&local_298)[-1].v[lVar5][lVar13] = dVar25;
      lVar13 = lVar13 + 1;
      padVar6 = (double (*) [3])(*padVar6 + 1);
    } while (lVar13 != 3);
    lVar5 = lVar5 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar5 != 3);
  pvVar7 = &local_168;
  local_150 = 0;
  local_140 = 0;
  uStack_138 = 0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_130 = 0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ff0000000000000;
  uStack_148 = 0x3ff0000000000000;
  local_128 = 0x3ff0000000000000;
  pdVar8 = &local_1b8;
  lVar5 = 0;
  do {
    lVar13 = 0;
    pdVar9 = pdVar8;
    do {
      (&(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start)[lVar13] = (pointer)*pdVar9;
      lVar13 = lVar13 + 1;
      pdVar9 = pdVar9 + 3;
    } while (lVar13 != 3);
    lVar5 = lVar5 + 1;
    pvVar7 = pvVar7 + 1;
    pdVar8 = pdVar8 + 1;
  } while (lVar5 != 3);
  local_400[3] = 0.0;
  local_400[5] = 0.0;
  local_400[6] = 0.0;
  local_400[1] = 0.0;
  local_400[2] = 0.0;
  local_400[7] = 0.0;
  local_400[0] = 1.0;
  local_400[4] = 1.0;
  local_400[8] = 1.0;
  pdVar8 = local_328 + 9;
  lVar5 = 0;
  do {
    lVar13 = 0;
    ppdVar12 = (pointer *)&local_168;
    do {
      dVar25 = 0.0;
      lVar16 = 0;
      ppdVar15 = ppdVar12;
      do {
        dVar25 = dVar25 + pdVar8[lVar16] * (double)*ppdVar15;
        lVar16 = lVar16 + 1;
        ppdVar15 = ppdVar15 + 3;
      } while (lVar16 != 3);
      local_400[lVar5 * 3 + lVar13] = dVar25;
      lVar13 = lVar13 + 1;
      ppdVar12 = ppdVar12 + 1;
    } while (lVar13 != 3);
    lVar5 = lVar5 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    *(undefined8 *)((long)local_328 + lVar5 + 0x10) =
         *(undefined8 *)((long)local_400 + lVar5 + 0x10);
    uVar3 = *(undefined8 *)((long)local_400 + lVar5 + 8);
    *(undefined8 *)((long)local_328 + lVar5) = *(undefined8 *)((long)local_400 + lVar5);
    *(undefined8 *)((long)local_328 + lVar5 + 8) = uVar3;
    dVar22 = local_328[8];
    dVar19 = local_328[7];
    dVar25 = local_328[5];
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  local_458[3] = local_388[2];
  local_358 = local_3a8[2];
  uStack_350 = 0;
  local_478 = local_328[4];
  uStack_470 = 0;
  local_468 = local_328[5] * local_328[5];
  dVar20 = local_328[8] * local_328[8];
  local_488.len = 0xc;
  local_488.c = (double *)operator_new__(0x60);
  local_488.used = 1;
  *local_488.c = 0.0;
  local_348._8_4_ = (int)uStack_470;
  local_348._0_8_ = local_478 * dVar25;
  local_348._12_4_ = (int)(uStack_470 >> 0x20);
  uStack_1c0 = uStack_470 ^ 0x8000000000000000;
  local_1c8 = -(local_478 * dVar25) * dVar20;
  local_330 = local_468 * dVar19 * dVar22;
  Polynomial<double>::set(&local_488,0,local_330 + local_1c8);
  local_418 = local_358 * local_358;
  local_428 = local_478 * local_478;
  local_438._8_8_ = 0;
  local_438._0_8_ = dVar19 * dVar19;
  local_338 = local_468 * dVar19 * dVar19;
  uStack_420 = uStack_470;
  local_400[9] = local_468 + local_468;
  uStack_410 = uStack_350;
  Polynomial<double>::set
            (&local_488,1,
             dVar20 * dVar20 * local_418 * local_418 +
             local_400[9] * dVar20 * local_418 +
             ((local_468 * local_468 + local_338) - local_428 * dVar20));
  local_368 = local_458[3] * local_458[3];
  local_1f8 = -local_428;
  uStack_1f0 = uStack_420 ^ 0x8000000000000000;
  local_348._0_8_ = (double)local_348._0_8_ * (double)local_438._0_8_;
  local_208 = dVar19 * local_1f8 * dVar22;
  uStack_200 = 0;
  local_1e8 = (local_478 + local_478) * dVar25;
  uStack_1e0 = uStack_470;
  uStack_360 = 0;
  local_1d8 = local_478 * 4.0 * dVar25;
  uStack_1d0 = uStack_470;
  Polynomial<double>::set
            (&local_488,2,
             dVar19 * 4.0 * dVar20 * dVar22 * local_418 * local_418 +
             local_1d8 * dVar20 * local_418 +
             local_468 * 4.0 * dVar19 * dVar22 * local_418 +
             ((dVar19 * local_400[9] * dVar22 * local_368 +
              local_478 * 4.0 * local_468 * dVar25 + (double)local_348._0_8_ + local_208) -
             dVar20 * local_1e8 * local_368));
  dVar21 = local_428 * 6.0 * local_468;
  local_468 = local_428 + local_428;
  uStack_460 = uStack_420;
  Polynomial<double>::set
            (&local_488,3,
             (double)local_438._0_8_ * 6.0 * dVar20 * local_418 * local_418 +
             local_468 * dVar20 * local_418 +
             local_478 * 8.0 * dVar25 * dVar19 * dVar22 * local_418 +
             local_400[9] * (double)local_438._0_8_ * local_418 +
             ((dVar21 + local_368 * local_400[9] * (double)local_438._0_8_) -
             local_468 * dVar20 * local_368));
  local_400[9] = local_368 * local_368;
  uStack_3b0 = uStack_360;
  Polynomial<double>::set
            (&local_488,4,
             (double)local_438._0_8_ * 4.0 * dVar19 * dVar22 * local_418 * local_418 +
             local_428 * 4.0 * dVar19 * dVar22 * local_418 +
             local_1d8 * (double)local_438._0_8_ * local_418 +
             local_1c8 * local_400[9] +
             local_330 * local_400[9] +
             ((local_478 * local_428 * 4.0 * dVar25 +
              local_1e8 * (double)local_438._0_8_ * local_368) -
             dVar19 * local_468 * dVar22 * local_368));
  Polynomial<double>::set
            (&local_488,5,
             (double)local_438._0_8_ * (double)local_438._0_8_ * local_418 * local_418 +
             local_468 * (double)local_438._0_8_ * local_418 +
             dVar20 * local_1f8 * local_400[9] + local_428 * local_428 + local_338 * local_400[9]);
  Polynomial<double>::set
            (&local_488,6,(double)local_348._0_8_ * local_400[9] + local_208 * local_400[9]);
  realRoots(&local_168,&local_488);
  pdVar4 = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar17 = 0xffffffff;
    uVar18 = 0x7fefffff;
    dVar20 = 1.79769313486232e+308;
  }
  else {
    lVar5 = (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    dVar20 = 1.79769313486232e+308;
    lVar13 = 0;
    uVar17 = 0xffffffff;
    uVar18 = 0x7fefffff;
    do {
      dVar21 = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13];
      dVar24 = local_478 * dVar21 + dVar25;
      dVar26 = dVar19 * dVar21 + dVar22;
      dVar24 = dVar24 * dVar24 + local_418 * dVar26 * dVar26;
      if ((dVar24 != 0.0) || (NAN(dVar24))) {
        auVar27._0_8_ = dVar21 * dVar21;
        auVar27._8_8_ = dVar26 * dVar26;
        auVar28._8_8_ = dVar24;
        auVar28._0_8_ = local_368 * dVar21 * dVar21 + 1.0;
        auVar28 = divpd(auVar27,auVar28);
        dVar24 = auVar28._8_8_ + auVar28._0_8_;
        if (dVar24 < dVar20) {
          uVar17 = SUB84(dVar21,0);
          uVar18 = (undefined4)((ulong)dVar21 >> 0x20);
          dVar20 = dVar24;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar13);
  }
  if ((0.0 < local_368) && (dVar21 = local_418 * dVar19 * dVar19 + local_428, 0.0 < dVar21)) {
    auVar23._8_8_ = local_438._0_8_;
    auVar23._0_8_ = 0x3ff0000000000000;
    auVar2._8_8_ = dVar21;
    auVar2._0_8_ = local_368;
    auVar28 = divpd(auVar23,auVar2);
    if (auVar28._8_8_ + auVar28._0_8_ < dVar20) {
      p0->v[0] = local_458[3];
      p0->v[1] = 0.0;
      p0->v[2] = local_368;
      p1->v[0] = (double)local_438._0_8_ * local_358;
      p1->v[1] = -local_478 * dVar19;
      dVar25 = local_418 * (double)local_438._0_8_ + local_428;
      goto LAB_00117868;
    }
  }
  dVar20 = (double)CONCAT44(uVar18,uVar17) * (double)CONCAT44(uVar18,uVar17);
  p0->v[0] = local_458[3] * dVar20;
  p0->v[1] = (double)CONCAT44(uVar18,uVar17);
  p0->v[2] = dVar20 * local_368 + 1.0;
  dVar22 = dVar19 * (double)CONCAT44(uVar18,uVar17) + dVar22;
  dVar25 = local_478 * (double)CONCAT44(uVar18,uVar17) + dVar25;
  auVar1._8_4_ = SUB84(dVar22 * -dVar25,0);
  auVar1._0_8_ = dVar22 * local_358 * dVar22;
  auVar1._12_4_ = (int)((ulong)(dVar22 * -dVar25) >> 0x20);
  *(undefined1 (*) [16])p1->v = auVar1;
  dVar25 = local_418 * dVar22 * dVar22 + dVar25 * dVar25;
LAB_00117868:
  p1->v[2] = dVar25;
  pdVar8 = local_328 + 9;
  local_328[0xc] = 0.0;
  local_328[0xe] = 0.0;
  local_328[0xf] = 0.0;
  local_328[10] = 0.0;
  local_328[0xb] = 0.0;
  local_328[0x10] = 0.0;
  local_328[9] = 1.0;
  local_328[0xd] = 1.0;
  local_328[0x11] = 1.0;
  pdVar9 = &local_1b8;
  lVar5 = 0;
  do {
    lVar13 = 0;
    pdVar11 = pdVar9;
    do {
      pdVar8[lVar13] = *pdVar11;
      lVar13 = lVar13 + 1;
      pdVar11 = pdVar11 + 3;
    } while (lVar13 != 3);
    lVar5 = lVar5 + 1;
    pdVar8 = pdVar8 + 3;
    pdVar9 = pdVar9 + 1;
  } while (lVar5 != 3);
  local_400[3] = 0.0;
  local_400[5] = 0.0;
  local_400[6] = 0.0;
  local_400[1] = 0.0;
  local_400[2] = 0.0;
  local_400[7] = 0.0;
  local_400[0] = 1.0;
  local_400[4] = 1.0;
  local_400[8] = 1.0;
  pdVar8 = local_250;
  lVar5 = 0;
  do {
    lVar13 = 0;
    pdVar9 = local_328 + 9;
    do {
      dVar25 = 0.0;
      lVar16 = 0;
      pdVar11 = pdVar9;
      do {
        dVar25 = dVar25 + pdVar8[lVar16] * *pdVar11;
        lVar16 = lVar16 + 1;
        pdVar11 = pdVar11 + 3;
      } while (lVar16 != 3);
      local_400[lVar5 * 3 + lVar13] = dVar25;
      lVar13 = lVar13 + 1;
      pdVar9 = pdVar9 + 1;
    } while (lVar13 != 3);
    lVar5 = lVar5 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar5 != 3);
  local_458[0] = 0.0;
  local_458[1] = 0.0;
  local_458[2] = 0.0;
  pdVar8 = local_400;
  lVar5 = 0;
  do {
    dVar25 = local_458[lVar5];
    lVar13 = 0;
    do {
      dVar25 = dVar25 + pdVar8[lVar13] * p0->v[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    local_458[lVar5] = dVar25;
    lVar5 = lVar5 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar5 != 3);
  p0->v[2] = local_458[2];
  p0->v[0] = local_458[0];
  p0->v[1] = local_458[1];
  pdVar8 = local_328 + 9;
  local_328[0xc] = 0.0;
  local_328[0xe] = 0.0;
  local_328[0xf] = 0.0;
  local_328[10] = 0.0;
  local_328[0xb] = 0.0;
  local_328[0x10] = 0.0;
  local_328[9] = 1.0;
  local_328[0xd] = 1.0;
  local_328[0x11] = 1.0;
  pdVar9 = &local_b8;
  lVar5 = 0;
  do {
    lVar13 = 0;
    pdVar11 = pdVar9;
    do {
      pdVar8[lVar13] = *pdVar11;
      lVar13 = lVar13 + 1;
      pdVar11 = pdVar11 + 3;
    } while (lVar13 != 3);
    lVar5 = lVar5 + 1;
    pdVar8 = pdVar8 + 3;
    pdVar9 = pdVar9 + 1;
  } while (lVar5 != 3);
  local_400[3] = 0.0;
  local_400[5] = 0.0;
  local_400[6] = 0.0;
  local_400[1] = 0.0;
  local_400[2] = 0.0;
  local_400[7] = 0.0;
  local_400[0] = 1.0;
  local_400[4] = 1.0;
  local_400[8] = 1.0;
  pdVar8 = local_70;
  lVar5 = 0;
  do {
    lVar13 = 0;
    pdVar9 = local_328 + 9;
    do {
      dVar25 = 0.0;
      lVar16 = 0;
      pdVar11 = pdVar9;
      do {
        dVar25 = dVar25 + pdVar8[lVar16] * *pdVar11;
        lVar16 = lVar16 + 1;
        pdVar11 = pdVar11 + 3;
      } while (lVar16 != 3);
      local_400[lVar5 * 3 + lVar13] = dVar25;
      lVar13 = lVar13 + 1;
      pdVar9 = pdVar9 + 1;
    } while (lVar13 != 3);
    lVar5 = lVar5 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar5 != 3);
  local_458[0] = 0.0;
  local_458[1] = 0.0;
  local_458[2] = 0.0;
  pdVar8 = local_400;
  lVar5 = 0;
  do {
    dVar25 = local_458[lVar5];
    lVar13 = 0;
    do {
      dVar25 = dVar25 + pdVar8[lVar13] * p1->v[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    local_458[lVar5] = dVar25;
    lVar5 = lVar5 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar5 != 3);
  p1->v[2] = local_458[2];
  p1->v[0] = local_458[0];
  p1->v[1] = local_458[1];
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4);
  }
  if (local_488.c != (double *)0x0) {
    operator_delete__(local_488.c);
  }
  return;
}

Assistant:

void refineOptimal(const Matrix33d &F, Vector3d &p0, Vector3d &p1)
{
  // the implementation follows Hartley and Zisserman's (2003, pp. 318)

  Matrix33d invT0;
  Matrix33d invT1;
  invT0(0, 2)=p0[0]/p0[2];
  invT0(1, 2)=p0[1]/p0[2];
  invT1(0, 2)=p1[0]/p1[2];
  invT1(1, 2)=p1[1]/p1[2];

  // transform F

  Matrix33d F2=transpose(invT1)*F*invT0;

  // get epipoles of new fundamental matrix

  Matrix33d U, V;
  Vector3d W;
  svd(F2, U, W, V);
  Vector3d e0=V.getColumn(2);
  Vector3d e1=U.getColumn(2);

  // compute rotations

  e0/=sqrt(e0[0]*e0[0]+e0[1]*e0[1]);
  e1/=sqrt(e1[0]*e1[0]+e1[1]*e1[1]);
  Matrix33d R0;
  R0(0, 0)=e0[0];
  R0(0, 1)=e0[1];
  R0(1, 0)=-e0[1];
  R0(1, 1)=e0[0];
  R0(2, 2)=1;
  Matrix33d R1;
  R1(0, 0)=e1[0];
  R1(0, 1)=e1[1];
  R1(1, 0)=-e1[1];
  R1(1, 1)=e1[0];
  R1(2, 2)=1;

  // compute new F

  F2=R1*F2*transpose(R0);

  // compute coefficients of polynomial

  const double f=e0[2];
  const double g=e1[2];
  const double a=F2(1, 1);
  const double b=F2(1, 2);
  const double c=F2(2, 1);
  const double d=F2(2, 2);
  const double f2=f*f;
  const double f4=f2*f2;
  const double g2=g*g;
  const double a2=a*a;
  const double b2=b*b;
  const double c2=c*c;
  const double d2=d*d;

  Polynomiald p;
  p.set(0, b2*c*d-a*b*d2);
  p.set(1, b2*b2+b2*c2-a2*d2+2*b2*d2*g2+d2*d2*g2*g2);
  p.set(2, 4*a*b2*b+a*b*c2-a2*c*d+2*b2*c*d*f2-2*a*b*d2*f2+4*b2*c*d*g2+4*a*b*d2*g2
        +4*c*d2*d*g2*g2);
  p.set(3, 6*a2*b2+2*b2*c2*f2-2*a2*d2*f2+2*b2*c2*g2+8*a*b*c*d*g2+2*a2*d2*g2
        +6*c2*d2*g2*g2);
  p.set(4, 4*a2*a*b+2*a*b*c2*f2-2*a2*c*d*f2+b2*c*d*f4-a*b*d2*f4+4*a*b*c2*g2
        +4*a2*c*d*g2+4*c2*c*d*g2*g2);
  p.set(5, a2*a2+b2*c2*f4-a2*d2*f4+2*a2*c2*g2+c2*c2*g2*g2);
  p.set(6, a*b*c2*f4-a2*c*d*f4);

  // setting polynomial to 0 and get all real roots

  std::vector<double> r=realRoots(p);

  // find global minima (solution is t)

  double t=std::numeric_limits<double>::max();
  double mins=std::numeric_limits<double>::max();

  for (size_t i=0; i<r.size(); i++)
  {
    double s=(a*r[i]+b)*(a*r[i]+b)+g*g*(c*r[i]+d)*(c*r[i]+d);

    if (s != 0)
    {
      s=r[i]*r[i]/(1+f*f*r[i]*r[i])+(c*r[i]+d)*(c*r[i]+d)/s;

      if (s < mins)
      {
        t=r[i];
        mins=s;
      }
    }
  }

  // get optimal corner positions

  if (f*f > 0 && a*a+g*g*c*c > 0 && 1/(f*f)+c*c/(a*a+g*g*c*c) < mins)
  {
    p0[0]=f;
    p0[1]=0;
    p0[2]=f2;
    p1[0]=g*c2;
    p1[1]=-a*c;
    p1[2]=g2*c2+a2;
  }
  else
  {
    p0[0]=t*t*f;
    p0[1]=t;
    p0[2]=t*t*f2+1;
    p1[0]=g*(c*t+d)*(c*t+d);
    p1[1]=-(a*t+b)*(c*t+d);
    p1[2]=g2*(c*t+d)*(c*t+d)+(a*t+b)*(a*t+b);
  }

  // transform refined points back

  p0=invT0*transpose(R0)*p0;
  p1=invT1*transpose(R1)*p1;
}